

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::UnpackHalf2x16Case::UnpackHalf2x16Case
          (UnpackHalf2x16Case *this,Context *context,ShaderType shaderType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  size_type *psVar4;
  string local_98;
  Symbol local_78;
  VarType local_40;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unpackhalf2x16","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar2 = &local_78.name.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_78.name.field_2._M_allocated_capacity = *psVar4;
    local_78.name.field_2._8_8_ = plVar3[3];
    local_78.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.name.field_2._M_allocated_capacity = *psVar4;
    local_78.name._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78.name._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,local_78.name._M_dataplus._M_p,"unpackHalf2x16");
  (this->super_ShaderPackingFunctionCase).super_TestCase.m_context = context;
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderPackingFunctionCase_00d36790;
  (this->super_ShaderPackingFunctionCase).m_shaderType = shaderType;
  (this->super_ShaderPackingFunctionCase).m_spec.version = GLSL_VERSION_300_ES;
  (this->super_ShaderPackingFunctionCase).m_spec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ShaderPackingFunctionCase).m_spec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ShaderPackingFunctionCase).m_spec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ShaderPackingFunctionCase).m_spec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ShaderPackingFunctionCase).m_spec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ShaderPackingFunctionCase).m_spec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ShaderPackingFunctionCase).m_spec.globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->super_ShaderPackingFunctionCase).m_spec.globalDeclarations.field_2;
  (this->super_ShaderPackingFunctionCase).m_spec.globalDeclarations._M_string_length = 0;
  (this->super_ShaderPackingFunctionCase).m_spec.globalDeclarations.field_2._M_local_buf[0] = '\0';
  (this->super_ShaderPackingFunctionCase).m_spec.source._M_dataplus._M_p =
       (pointer)&(this->super_ShaderPackingFunctionCase).m_spec.source.field_2;
  (this->super_ShaderPackingFunctionCase).m_spec.source._M_string_length = 0;
  (this->super_ShaderPackingFunctionCase).m_spec.source.field_2._M_local_buf[0] = '\0';
  (this->super_ShaderPackingFunctionCase).m_executor = (ShaderExecutor *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderPackingFunctionCase_00d369f0;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"in0","");
  glu::VarType::VarType(&local_40,TYPE_UINT,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_78,&local_98,&local_40);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_78);
  glu::VarType::~VarType(&local_78.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"out0","");
  glu::VarType::VarType(&local_40,TYPE_FLOAT_VEC2,PRECISION_MEDIUMP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_78,&local_98,&local_40);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_78);
  glu::VarType::~VarType(&local_78.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderPackingFunctionCase).m_spec.source,0,
             (char *)(this->super_ShaderPackingFunctionCase).m_spec.source._M_string_length,0xb44590
            );
  return;
}

Assistant:

UnpackHalf2x16Case (Context& context, glu::ShaderType shaderType)
		: ShaderPackingFunctionCase(context, (string("unpackhalf2x16") + getShaderTypePostfix(shaderType)).c_str(), "unpackHalf2x16", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_MEDIUMP)));

		m_spec.source = "out0 = unpackHalf2x16(in0);";
	}